

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O3

uint16 crnlib::etc1_block::pack_color4(uint r,uint g,uint b,bool scaled,uint bias)

{
  uint uVar1;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,scaled) != 0) {
    r = (r * 0xf + bias) / 0xff;
    g = (g * 0xf + bias) / 0xff;
    b = (b * 0xf + bias) / 0xff;
  }
  if (0xe < r) {
    r = 0xf;
  }
  if (0xe < g) {
    g = 0xf;
  }
  uVar1 = 0xf;
  if (b < 0xf) {
    uVar1 = b;
  }
  return (ushort)(r << 8) | (ushort)(g << 4) | (ushort)uVar1;
}

Assistant:

uint16 etc1_block::pack_color4(uint r, uint g, uint b, bool scaled, uint bias) {
  if (scaled) {
    r = (r * 15U + bias) / 255U;
    g = (g * 15U + bias) / 255U;
    b = (b * 15U + bias) / 255U;
  }

  r = math::minimum(r, 15U);
  g = math::minimum(g, 15U);
  b = math::minimum(b, 15U);

  return static_cast<uint16>(b | (g << 4U) | (r << 8U));
}